

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O0

int64_t get_clock(void)

{
  undefined1 local_20 [8];
  timespec ts;
  
  if (use_rt_clock == 0) {
    ts.tv_nsec = get_clock_realtime();
  }
  else {
    clock_gettime(1,(timespec *)local_20);
    ts.tv_nsec = (long)local_20 * 1000000000 + ts.tv_sec;
  }
  return ts.tv_nsec;
}

Assistant:

static inline int64_t get_clock(void)
{
    if (use_rt_clock) {
        struct timespec ts;
        clock_gettime(CLOCK_MONOTONIC, &ts);
        return ts.tv_sec * 1000000000LL + ts.tv_nsec;
    } else {
        /* XXX: using gettimeofday leads to problems if the date
           changes, so it should be avoided. */
        return get_clock_realtime();
    }
}